

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

void Gia_QbfLearnConstraint(Qbf_Man_t *p,Vec_Int_t *vValues)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int Lits [2];
  uint local_38;
  lit local_34;
  
  if (vValues->nSize != p->nPars) {
    __assert_fail("Vec_IntSize(vValues) == p->nPars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaQbf.c"
                  ,0x23b,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
  }
  printf("  Pattern   ");
  if (0 < vValues->nSize) {
    lVar3 = 0;
    do {
      printf("%d",(ulong)(vValues->pArray[lVar3] != 0));
      lVar3 = lVar3 + 1;
    } while (lVar3 < vValues->nSize);
  }
  putchar(10);
  iVar2 = vValues->nSize;
  if (0 < iVar2) {
    uVar4 = 0;
    do {
      if (1 < (uint)vValues->pArray[uVar4]) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      local_38 = vValues->pArray[uVar4] + (int)uVar4 * 2;
      iVar2 = sat_solver_solve(p->pSatSyn,(lit *)&local_38,&local_34,0,0,0,0);
      printf("  Var =%4d ",uVar4 & 0xffffffff);
      if (iVar2 == 1) {
        Gia_QbfOnePattern(p,p->vLits);
        pVVar1 = p->vLits;
        if (0 < pVVar1->nSize) {
          lVar3 = 0;
          do {
            printf("%d",(ulong)(pVVar1->pArray[lVar3] != 0));
            lVar3 = lVar3 + 1;
          } while (lVar3 < pVVar1->nSize);
        }
        putchar(10);
      }
      else {
        puts("UNSAT");
        if ((int)local_38 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf4,"int Abc_LitNot(int)");
        }
        local_38 = local_38 ^ 1;
        iVar2 = sat_solver_addclause(p->pSatSyn,(lit *)&local_38,&local_34);
        if (iVar2 == 0) {
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaQbf.c"
                        ,0x249,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
        }
      }
      uVar4 = uVar4 + 1;
      iVar2 = vValues->nSize;
    } while ((long)uVar4 < (long)iVar2);
  }
  if (iVar2 == p->nPars) {
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == p->nPars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaQbf.c"
                ,0x250,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_QbfLearnConstraint( Qbf_Man_t * p, Vec_Int_t * vValues )
{
    int i, status, Entry, Lits[2];
    assert( Vec_IntSize(vValues) == p->nPars );
    printf( "  Pattern   " );
    Vec_IntPrintBinary( vValues );
    printf( "\n" );
    Vec_IntForEachEntry( vValues, Entry, i )
    {
        Lits[0] = Abc_Var2Lit( i, Entry );
        status = sat_solver_solve( p->pSatSyn, Lits, Lits+1, 0, 0, 0, 0 );
        printf( "  Var =%4d ", i );
        if ( status != l_True )
        {
            printf( "UNSAT\n" );
            Lits[0] = Abc_LitNot(Lits[0]);
            status = sat_solver_addclause( p->pSatSyn, Lits, Lits+1 );
            assert( status );
            continue;
        }
        Gia_QbfOnePattern( p, p->vLits );
        Vec_IntPrintBinary( p->vLits );
        printf( "\n" );
    }
    assert( Vec_IntSize(vValues) == p->nPars );
}